

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O2

int Vec_WecSizeSize(Vec_Wec_t *p)

{
  Vec_Int_t *pVVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < p->nSize; i = i + 1) {
    pVVar1 = Vec_WecEntry(p,i);
    iVar2 = iVar2 + pVVar1->nSize;
  }
  return iVar2;
}

Assistant:

static inline int Vec_WecSizeSize( Vec_Wec_t * p )
{
    Vec_Int_t * vVec;
    int i, Counter = 0;
    Vec_WecForEachLevel( p, vVec, i )
        Counter += Vec_IntSize(vVec);
    return Counter;
}